

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

unique_ptr<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>_> __thiscall
lunasvg::SVGElement::create(SVGElement *this,Document *document,ElementID id)

{
  unique_ptr<lunasvg::SVGTSpanElement,_std::default_delete<lunasvg::SVGTSpanElement>_> local_d0;
  unique_ptr<lunasvg::SVGTextElement,_std::default_delete<lunasvg::SVGTextElement>_> local_c8;
  unique_ptr<lunasvg::SVGStyleElement,_std::default_delete<lunasvg::SVGStyleElement>_> local_c0;
  unique_ptr<lunasvg::SVGImageElement,_std::default_delete<lunasvg::SVGImageElement>_> local_b8;
  unique_ptr<lunasvg::SVGMarkerElement,_std::default_delete<lunasvg::SVGMarkerElement>_> local_b0;
  unique_ptr<lunasvg::SVGClipPathElement,_std::default_delete<lunasvg::SVGClipPathElement>_>
  local_a8;
  unique_ptr<lunasvg::SVGMaskElement,_std::default_delete<lunasvg::SVGMaskElement>_> local_a0;
  unique_ptr<lunasvg::SVGPatternElement,_std::default_delete<lunasvg::SVGPatternElement>_> local_98;
  unique_ptr<lunasvg::SVGUseElement,_std::default_delete<lunasvg::SVGUseElement>_> local_90;
  unique_ptr<lunasvg::SVGSymbolElement,_std::default_delete<lunasvg::SVGSymbolElement>_> local_88;
  unique_ptr<lunasvg::SVGRadialGradientElement,_std::default_delete<lunasvg::SVGRadialGradientElement>_>
  local_80;
  unique_ptr<lunasvg::SVGLinearGradientElement,_std::default_delete<lunasvg::SVGLinearGradientElement>_>
  local_78;
  unique_ptr<lunasvg::SVGStopElement,_std::default_delete<lunasvg::SVGStopElement>_> local_70;
  unique_ptr<lunasvg::SVGPolyElement,_std::default_delete<lunasvg::SVGPolyElement>_> local_68;
  unique_ptr<lunasvg::SVGDefsElement,_std::default_delete<lunasvg::SVGDefsElement>_> local_60;
  unique_ptr<lunasvg::SVGLineElement,_std::default_delete<lunasvg::SVGLineElement>_> local_58;
  unique_ptr<lunasvg::SVGEllipseElement,_std::default_delete<lunasvg::SVGEllipseElement>_> local_50;
  unique_ptr<lunasvg::SVGCircleElement,_std::default_delete<lunasvg::SVGCircleElement>_> local_48;
  unique_ptr<lunasvg::SVGRectElement,_std::default_delete<lunasvg::SVGRectElement>_> local_40;
  unique_ptr<lunasvg::SVGGElement,_std::default_delete<lunasvg::SVGGElement>_> local_38;
  unique_ptr<lunasvg::SVGPathElement,_std::default_delete<lunasvg::SVGPathElement>_> local_30;
  unique_ptr<lunasvg::SVGSVGElement,_std::default_delete<lunasvg::SVGSVGElement>_> local_28;
  ElementID local_19;
  Document *pDStack_18;
  ElementID id_local;
  Document *document_local;
  
  local_19 = id;
  pDStack_18 = document;
  document_local = (Document *)this;
  switch(id) {
  case Circle:
    std::make_unique<lunasvg::SVGCircleElement,lunasvg::Document*&>((Document **)&local_48);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGCircleElement,std::default_delete<lunasvg::SVGCircleElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_48);
    std::unique_ptr<lunasvg::SVGCircleElement,_std::default_delete<lunasvg::SVGCircleElement>_>::
    ~unique_ptr(&local_48);
    break;
  case ClipPath:
    std::make_unique<lunasvg::SVGClipPathElement,lunasvg::Document*&>((Document **)&local_a8);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGClipPathElement,std::default_delete<lunasvg::SVGClipPathElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_a8);
    std::unique_ptr<lunasvg::SVGClipPathElement,_std::default_delete<lunasvg::SVGClipPathElement>_>
    ::~unique_ptr(&local_a8);
    break;
  case Defs:
    std::make_unique<lunasvg::SVGDefsElement,lunasvg::Document*&>((Document **)&local_60);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGDefsElement,std::default_delete<lunasvg::SVGDefsElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_60);
    std::unique_ptr<lunasvg::SVGDefsElement,_std::default_delete<lunasvg::SVGDefsElement>_>::
    ~unique_ptr(&local_60);
    break;
  case Ellipse:
    std::make_unique<lunasvg::SVGEllipseElement,lunasvg::Document*&>((Document **)&local_50);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGEllipseElement,std::default_delete<lunasvg::SVGEllipseElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_50);
    std::unique_ptr<lunasvg::SVGEllipseElement,_std::default_delete<lunasvg::SVGEllipseElement>_>::
    ~unique_ptr(&local_50);
    break;
  case G:
    std::make_unique<lunasvg::SVGGElement,lunasvg::Document*&>((Document **)&local_38);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGGElement,std::default_delete<lunasvg::SVGGElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_38);
    std::unique_ptr<lunasvg::SVGGElement,_std::default_delete<lunasvg::SVGGElement>_>::~unique_ptr
              (&local_38);
    break;
  case Image:
    std::make_unique<lunasvg::SVGImageElement,lunasvg::Document*&>((Document **)&local_b8);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGImageElement,std::default_delete<lunasvg::SVGImageElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_b8);
    std::unique_ptr<lunasvg::SVGImageElement,_std::default_delete<lunasvg::SVGImageElement>_>::
    ~unique_ptr(&local_b8);
    break;
  case Line:
    std::make_unique<lunasvg::SVGLineElement,lunasvg::Document*&>((Document **)&local_58);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGLineElement,std::default_delete<lunasvg::SVGLineElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_58);
    std::unique_ptr<lunasvg::SVGLineElement,_std::default_delete<lunasvg::SVGLineElement>_>::
    ~unique_ptr(&local_58);
    break;
  case LinearGradient:
    std::make_unique<lunasvg::SVGLinearGradientElement,lunasvg::Document*&>((Document **)&local_78);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGLinearGradientElement,std::default_delete<lunasvg::SVGLinearGradientElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_78);
    std::
    unique_ptr<lunasvg::SVGLinearGradientElement,_std::default_delete<lunasvg::SVGLinearGradientElement>_>
    ::~unique_ptr(&local_78);
    break;
  case Marker:
    std::make_unique<lunasvg::SVGMarkerElement,lunasvg::Document*&>((Document **)&local_b0);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGMarkerElement,std::default_delete<lunasvg::SVGMarkerElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_b0);
    std::unique_ptr<lunasvg::SVGMarkerElement,_std::default_delete<lunasvg::SVGMarkerElement>_>::
    ~unique_ptr(&local_b0);
    break;
  case Mask:
    std::make_unique<lunasvg::SVGMaskElement,lunasvg::Document*&>((Document **)&local_a0);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGMaskElement,std::default_delete<lunasvg::SVGMaskElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_a0);
    std::unique_ptr<lunasvg::SVGMaskElement,_std::default_delete<lunasvg::SVGMaskElement>_>::
    ~unique_ptr(&local_a0);
    break;
  case Path:
    std::make_unique<lunasvg::SVGPathElement,lunasvg::Document*&>((Document **)&local_30);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGPathElement,std::default_delete<lunasvg::SVGPathElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_30);
    std::unique_ptr<lunasvg::SVGPathElement,_std::default_delete<lunasvg::SVGPathElement>_>::
    ~unique_ptr(&local_30);
    break;
  case Pattern:
    std::make_unique<lunasvg::SVGPatternElement,lunasvg::Document*&>((Document **)&local_98);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGPatternElement,std::default_delete<lunasvg::SVGPatternElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_98);
    std::unique_ptr<lunasvg::SVGPatternElement,_std::default_delete<lunasvg::SVGPatternElement>_>::
    ~unique_ptr(&local_98);
    break;
  case Polygon:
  case Polyline:
    std::make_unique<lunasvg::SVGPolyElement,lunasvg::Document*&,lunasvg::ElementID&>
              ((Document **)&local_68,(ElementID *)&stack0xffffffffffffffe8);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGPolyElement,std::default_delete<lunasvg::SVGPolyElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_68);
    std::unique_ptr<lunasvg::SVGPolyElement,_std::default_delete<lunasvg::SVGPolyElement>_>::
    ~unique_ptr(&local_68);
    break;
  case RadialGradient:
    std::make_unique<lunasvg::SVGRadialGradientElement,lunasvg::Document*&>((Document **)&local_80);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGRadialGradientElement,std::default_delete<lunasvg::SVGRadialGradientElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_80);
    std::
    unique_ptr<lunasvg::SVGRadialGradientElement,_std::default_delete<lunasvg::SVGRadialGradientElement>_>
    ::~unique_ptr(&local_80);
    break;
  case Rect:
    std::make_unique<lunasvg::SVGRectElement,lunasvg::Document*&>((Document **)&local_40);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGRectElement,std::default_delete<lunasvg::SVGRectElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_40);
    std::unique_ptr<lunasvg::SVGRectElement,_std::default_delete<lunasvg::SVGRectElement>_>::
    ~unique_ptr(&local_40);
    break;
  case Stop:
    std::make_unique<lunasvg::SVGStopElement,lunasvg::Document*&>((Document **)&local_70);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGStopElement,std::default_delete<lunasvg::SVGStopElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_70);
    std::unique_ptr<lunasvg::SVGStopElement,_std::default_delete<lunasvg::SVGStopElement>_>::
    ~unique_ptr(&local_70);
    break;
  case Style:
    std::make_unique<lunasvg::SVGStyleElement,lunasvg::Document*&>((Document **)&local_c0);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGStyleElement,std::default_delete<lunasvg::SVGStyleElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_c0);
    std::unique_ptr<lunasvg::SVGStyleElement,_std::default_delete<lunasvg::SVGStyleElement>_>::
    ~unique_ptr(&local_c0);
    break;
  case Svg:
    std::make_unique<lunasvg::SVGSVGElement,lunasvg::Document*&>((Document **)&local_28);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGSVGElement,std::default_delete<lunasvg::SVGSVGElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_28);
    std::unique_ptr<lunasvg::SVGSVGElement,_std::default_delete<lunasvg::SVGSVGElement>_>::
    ~unique_ptr(&local_28);
    break;
  case Symbol:
    std::make_unique<lunasvg::SVGSymbolElement,lunasvg::Document*&>((Document **)&local_88);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGSymbolElement,std::default_delete<lunasvg::SVGSymbolElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_88);
    std::unique_ptr<lunasvg::SVGSymbolElement,_std::default_delete<lunasvg::SVGSymbolElement>_>::
    ~unique_ptr(&local_88);
    break;
  case Text:
    std::make_unique<lunasvg::SVGTextElement,lunasvg::Document*&>((Document **)&local_c8);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGTextElement,std::default_delete<lunasvg::SVGTextElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_c8);
    std::unique_ptr<lunasvg::SVGTextElement,_std::default_delete<lunasvg::SVGTextElement>_>::
    ~unique_ptr(&local_c8);
    break;
  case Tspan:
    std::make_unique<lunasvg::SVGTSpanElement,lunasvg::Document*&>((Document **)&local_d0);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGTSpanElement,std::default_delete<lunasvg::SVGTSpanElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_d0);
    std::unique_ptr<lunasvg::SVGTSpanElement,_std::default_delete<lunasvg::SVGTSpanElement>_>::
    ~unique_ptr(&local_d0);
    break;
  case Use:
    std::make_unique<lunasvg::SVGUseElement,lunasvg::Document*&>((Document **)&local_90);
    std::unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>>::
    unique_ptr<lunasvg::SVGUseElement,std::default_delete<lunasvg::SVGUseElement>,void>
              ((unique_ptr<lunasvg::SVGElement,std::default_delete<lunasvg::SVGElement>> *)this,
               &local_90);
    std::unique_ptr<lunasvg::SVGUseElement,_std::default_delete<lunasvg::SVGUseElement>_>::
    ~unique_ptr(&local_90);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgelement.cpp"
                  ,0x76,
                  "static std::unique_ptr<SVGElement> lunasvg::SVGElement::create(Document *, ElementID)"
                 );
  }
  return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
         )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<SVGElement> SVGElement::create(Document* document, ElementID id)
{
    switch(id) {
    case ElementID::Svg:
        return std::make_unique<SVGSVGElement>(document);
    case ElementID::Path:
        return std::make_unique<SVGPathElement>(document);
    case ElementID::G:
        return std::make_unique<SVGGElement>(document);
    case ElementID::Rect:
        return std::make_unique<SVGRectElement>(document);
    case ElementID::Circle:
        return std::make_unique<SVGCircleElement>(document);
    case ElementID::Ellipse:
        return std::make_unique<SVGEllipseElement>(document);
    case ElementID::Line:
        return std::make_unique<SVGLineElement>(document);
    case ElementID::Defs:
        return std::make_unique<SVGDefsElement>(document);
    case ElementID::Polygon:
    case ElementID::Polyline:
        return std::make_unique<SVGPolyElement>(document, id);
    case ElementID::Stop:
        return std::make_unique<SVGStopElement>(document);
    case ElementID::LinearGradient:
        return std::make_unique<SVGLinearGradientElement>(document);
    case ElementID::RadialGradient:
        return std::make_unique<SVGRadialGradientElement>(document);
    case ElementID::Symbol:
        return std::make_unique<SVGSymbolElement>(document);
    case ElementID::Use:
        return std::make_unique<SVGUseElement>(document);
    case ElementID::Pattern:
        return std::make_unique<SVGPatternElement>(document);
    case ElementID::Mask:
        return std::make_unique<SVGMaskElement>(document);
    case ElementID::ClipPath:
        return std::make_unique<SVGClipPathElement>(document);
    case ElementID::Marker:
        return std::make_unique<SVGMarkerElement>(document);
    case ElementID::Image:
        return std::make_unique<SVGImageElement>(document);
    case ElementID::Style:
        return std::make_unique<SVGStyleElement>(document);
    case ElementID::Text:
        return std::make_unique<SVGTextElement>(document);
    case ElementID::Tspan:
        return std::make_unique<SVGTSpanElement>(document);
    default:
        assert(false);
    }

    return nullptr;
}